

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void * Map_Check(Map *tree,void *str,size_t size)

{
  ulong local_30;
  size_t temp;
  size_t size_local;
  void *str_local;
  Map *tree_local;
  
  temp = size;
  size_local = (size_t)str;
  str_local = tree;
  Map_Scour(tree,str,size,&local_30,(Map **)&str_local);
  if (local_30 < temp) {
    tree_local = (Map *)0x0;
  }
  else {
    tree_local = *(Map **)((long)str_local + 0x808);
  }
  return tree_local;
}

Assistant:

void* Map_Check(Map *tree, void *str,size_t size)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);

	if(temp<size)
	{
		return NULL;	
	}else
	{
		return tree->ID; //this has been set to be the last reached node
	}
}